

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O1

QString * qt_findAtNxFile(QString *__return_storage_ptr__,QString *baseFileName,
                         qreal targetDevicePixelRatio,qreal *sourceDevicePixelRatio)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  double dVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  char cVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  long in_FS_OFFSET;
  QStringView QVar15;
  QLatin1String QVar16;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sourceDevicePixelRatio != (qreal *)0x0) {
    *sourceDevicePixelRatio = 1.0;
  }
  if (1.0 < targetDevicePixelRatio) {
    if (qt_findAtNxFile(QString_const&,double,double*)::disableNxImageLoading == '\0') {
      qt_findAtNxFile();
    }
    if (qt_findAtNxFile::disableNxImageLoading != true) {
      pcVar2 = (baseFileName->d).ptr;
      qVar3 = (baseFileName->d).size;
      QVar15.m_data = pcVar2;
      QVar15.m_size = qVar3;
      uVar11 = QtPrivate::lastIndexOf(QVar15,-1,L'.',CaseSensitive);
      if (uVar11 == 0xffffffff) {
        uVar12 = (uint)qVar3;
      }
      else {
        uVar12 = uVar11;
        if (((1 < (int)uVar11) && (pcVar2[uVar11 - 1] == L'9')) &&
           (uVar12 = uVar11 - 2, pcVar2[uVar11 - 2] != L'.')) {
          uVar12 = uVar11;
        }
      }
      local_58.d.d = (baseFileName->d).d;
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar16.m_data = (char *)0x3;
      QVar16.m_size = (long)(int)uVar12;
      local_58.d.ptr = pcVar2;
      local_58.d.size = qVar3;
      QString::insert((longlong)&local_58,QVar16);
      dVar5 = ceil(targetDevicePixelRatio);
      iVar13 = (int)dVar5;
      if (1 < iVar13) {
        iVar14 = 9;
        if (iVar13 < 9) {
          iVar14 = iVar13;
        }
        do {
          if ((&(local_58.d.d)->super_QArrayData == (QArrayData *)0x0) ||
             (1 < ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QString::reallocData((longlong)&local_58,(AllocationOption)local_58.d.size);
          }
          local_58.d.ptr[(long)(int)uVar12 + 1] = (ushort)(byte)((char)iVar14 + 0x30);
          cVar10 = QFile::exists(&local_58);
          qVar3 = local_58.d.size;
          if (cVar10 != '\0') {
            if (sourceDevicePixelRatio != (qreal *)0x0) {
              *sourceDevicePixelRatio = (double)iVar14;
            }
            uVar6 = local_58.d.d._0_4_;
            uVar7 = local_58.d.d._4_4_;
            uVar8 = local_58.d.ptr._0_4_;
            uVar9 = local_58.d.ptr._4_4_;
            local_58.d.d = (Data *)0x0;
            local_58.d.ptr = (char16_t *)0x0;
            *(undefined4 *)&(__return_storage_ptr__->d).d = uVar6;
            *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar7;
            *(undefined4 *)&(__return_storage_ptr__->d).ptr = uVar8;
            *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uVar9;
            local_58.d.size = 0;
            (__return_storage_ptr__->d).size = qVar3;
            goto LAB_00272dfe;
          }
          bVar4 = 2 < iVar14;
          iVar14 = iVar14 + -1;
        } while (bVar4);
      }
      pDVar1 = (baseFileName->d).d;
      (__return_storage_ptr__->d).d = pDVar1;
      (__return_storage_ptr__->d).ptr = (baseFileName->d).ptr;
      (__return_storage_ptr__->d).size = (baseFileName->d).size;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
LAB_00272dfe:
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_00272c6e;
    }
  }
  pDVar1 = (baseFileName->d).d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (baseFileName->d).ptr;
  (__return_storage_ptr__->d).size = (baseFileName->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
LAB_00272c6e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString qt_findAtNxFile(const QString &baseFileName, qreal targetDevicePixelRatio,
                        qreal *sourceDevicePixelRatio)
{
    if (sourceDevicePixelRatio)
        *sourceDevicePixelRatio = 1;
    if (targetDevicePixelRatio <= 1.0)
        return baseFileName;

    static bool disableNxImageLoading = !qEnvironmentVariableIsEmpty("QT_HIGHDPI_DISABLE_2X_IMAGE_LOADING");
    if (disableNxImageLoading)
        return baseFileName;

    int dotIndex = baseFileName.lastIndexOf(u'.');
    if (dotIndex == -1) { /* no dot */
        dotIndex = baseFileName.size(); /* append */
    } else if (dotIndex >= 2 && baseFileName[dotIndex - 1] == u'9'
        && baseFileName[dotIndex - 2] == u'.') {
        // If the file has a .9.* (9-patch image) extension, we must ensure that the @nx goes before it.
        dotIndex -= 2;
    }

    QString atNxfileName = baseFileName;
    atNxfileName.insert(dotIndex, "@2x"_L1);
    // Check for @Nx, ..., @3x, @2x file versions,
    for (int n = qMin(qCeil(targetDevicePixelRatio), 9); n > 1; --n) {
        atNxfileName[dotIndex + 1] = QLatin1Char('0' + n);
        if (QFile::exists(atNxfileName)) {
            if (sourceDevicePixelRatio)
                *sourceDevicePixelRatio = n;
            return atNxfileName;
        }
    }

    return baseFileName;
}